

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O3

void Ssw_MatchingExtendOne(Aig_Man_t *p,Vec_Ptr_t *vNodes)

{
  int *piVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  void *pvVar8;
  int *piVar9;
  uint uVar10;
  long lVar11;
  
  vNodes->nSize = 0;
  Aig_ManIncrementTravId(p);
  pVVar3 = p->vObjs;
  if (0 < pVVar3->nSize) {
    uVar10 = 0xffffffff;
    lVar11 = 0;
    do {
      piVar1 = (int *)pVVar3->pArray[lVar11];
      if (((piVar1 != (int *)0x0) &&
          (uVar2 = (uint)*(undefined8 *)(piVar1 + 6) & 7, uVar2 == 2 || uVar2 - 5 < 2)) &&
         (*(long *)(piVar1 + 10) == 0)) {
        if ((uVar2 == 2) && (p->nTruePis <= *piVar1)) {
          uVar6 = (*piVar1 - p->nTruePis) + p->nTruePos;
          if (((int)uVar6 < 0) || (p->vCos->nSize <= (int)uVar6)) {
LAB_006af1a0:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar8 = (void *)(*(ulong *)((long)p->vCos->pArray[uVar6] + 8) & 0xfffffffffffffffe);
          if (((*(long *)((long)pvVar8 + 0x28) != 0) &&
              (*(int *)((long)pvVar8 + 0x20) != p->nTravIds)) &&
             ((*(uint *)((long)pvVar8 + 0x18) & 7) != 1)) {
            *(int *)((long)pvVar8 + 0x20) = p->nTravIds;
            uVar2 = vNodes->nSize;
            if (uVar2 == vNodes->nCap) {
              if ((int)uVar2 < 0x10) {
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc(0x80);
                }
                else {
                  ppvVar4 = (void **)realloc(vNodes->pArray,0x80);
                }
                vNodes->pArray = ppvVar4;
                vNodes->nCap = 0x10;
              }
              else {
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
                }
                else {
                  ppvVar4 = (void **)realloc(vNodes->pArray,(ulong)uVar2 << 4);
                }
                vNodes->pArray = ppvVar4;
                vNodes->nCap = uVar2 * 2;
              }
            }
            else {
              ppvVar4 = vNodes->pArray;
            }
            iVar7 = vNodes->nSize;
            vNodes->nSize = iVar7 + 1;
            ppvVar4[iVar7] = pvVar8;
            uVar2 = piVar1[6] & 7;
          }
        }
        if (0xfffffffd < uVar2 - 7) {
          pvVar8 = (void *)(*(ulong *)(piVar1 + 2) & 0xfffffffffffffffe);
          if ((*(long *)((long)pvVar8 + 0x28) != 0) &&
             (*(int *)((long)pvVar8 + 0x20) != p->nTravIds)) {
            *(int *)((long)pvVar8 + 0x20) = p->nTravIds;
            uVar2 = vNodes->nSize;
            if (uVar2 == vNodes->nCap) {
              if ((int)uVar2 < 0x10) {
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc(0x80);
                }
                else {
                  ppvVar4 = (void **)realloc(vNodes->pArray,0x80);
                }
                vNodes->pArray = ppvVar4;
                vNodes->nCap = 0x10;
              }
              else {
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
                }
                else {
                  ppvVar4 = (void **)realloc(vNodes->pArray,(ulong)uVar2 << 4);
                }
                vNodes->pArray = ppvVar4;
                vNodes->nCap = uVar2 * 2;
              }
            }
            else {
              ppvVar4 = vNodes->pArray;
            }
            iVar7 = vNodes->nSize;
            vNodes->nSize = iVar7 + 1;
            ppvVar4[iVar7] = pvVar8;
          }
          pvVar8 = (void *)(*(ulong *)(piVar1 + 4) & 0xfffffffffffffffe);
          if ((*(long *)((long)pvVar8 + 0x28) != 0) &&
             (*(int *)((long)pvVar8 + 0x20) != p->nTravIds)) {
            *(int *)((long)pvVar8 + 0x20) = p->nTravIds;
            uVar2 = vNodes->nSize;
            if (uVar2 == vNodes->nCap) {
              if ((int)uVar2 < 0x10) {
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc(0x80);
                }
                else {
                  ppvVar4 = (void **)realloc(vNodes->pArray,0x80);
                }
                vNodes->pArray = ppvVar4;
                vNodes->nCap = 0x10;
              }
              else {
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
                }
                else {
                  ppvVar4 = (void **)realloc(vNodes->pArray,(ulong)uVar2 << 4);
                }
                vNodes->pArray = ppvVar4;
                vNodes->nCap = uVar2 * 2;
              }
            }
            else {
              ppvVar4 = vNodes->pArray;
            }
            iVar7 = vNodes->nSize;
            vNodes->nSize = iVar7 + 1;
            ppvVar4[iVar7] = pvVar8;
          }
        }
        if (p->pFanData == (int *)0x0) {
          __assert_fail("p->pFanData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswIslands.c"
                        ,0xa7,"void Ssw_MatchingExtendOne(Aig_Man_t *, Vec_Ptr_t *)");
        }
        uVar5 = *(ulong *)(piVar1 + 6);
        if ((uVar5 & 0xffffffc0) != 0) {
          uVar2 = 0;
          do {
            if (uVar2 == 0) {
              if (p->nFansAlloc <= piVar1[9]) {
                __assert_fail("ObjId < p->nFansAlloc",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                              ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
              }
              iVar7 = piVar1[9] * 5;
            }
            else {
              if (p->nFansAlloc <= (int)uVar10 / 2) {
                __assert_fail("iFan/2 < p->nFansAlloc",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                              ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
              }
              iVar7 = (uVar10 & 1) + ((int)uVar10 >> 1) * 5 + 3;
            }
            pVVar3 = p->vObjs;
            uVar10 = p->pFanData[iVar7];
            if (pVVar3 == (Vec_Ptr_t *)0x0) {
              piVar9 = (int *)0x0;
            }
            else {
              uVar6 = (int)uVar10 >> 1;
              if (((int)uVar6 < 0) || (pVVar3->nSize <= (int)uVar6)) goto LAB_006af1a0;
              piVar9 = (int *)pVVar3->pArray[uVar6];
            }
            if ((piVar9[6] & 7U) == 3) {
              if (p->nTruePos <= *piVar9) {
                uVar6 = (*piVar9 - p->nTruePos) + p->nTruePis;
                if ((-1 < (int)uVar6) && ((int)uVar6 < p->vCis->nSize)) {
                  piVar9 = (int *)p->vCis->pArray[uVar6];
                  goto LAB_006af0c6;
                }
                goto LAB_006af1a0;
              }
            }
            else {
LAB_006af0c6:
              if ((*(long *)(piVar9 + 10) != 0) && (piVar9[8] != p->nTravIds)) {
                piVar9[8] = p->nTravIds;
                uVar6 = vNodes->nSize;
                if (uVar6 == vNodes->nCap) {
                  if ((int)uVar6 < 0x10) {
                    if (vNodes->pArray == (void **)0x0) {
                      ppvVar4 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar4 = (void **)realloc(vNodes->pArray,0x80);
                    }
                    vNodes->pArray = ppvVar4;
                    vNodes->nCap = 0x10;
                  }
                  else {
                    if (vNodes->pArray == (void **)0x0) {
                      ppvVar4 = (void **)malloc((ulong)uVar6 << 4);
                    }
                    else {
                      ppvVar4 = (void **)realloc(vNodes->pArray,(ulong)uVar6 << 4);
                    }
                    vNodes->pArray = ppvVar4;
                    vNodes->nCap = uVar6 * 2;
                  }
                }
                else {
                  ppvVar4 = vNodes->pArray;
                }
                iVar7 = vNodes->nSize;
                vNodes->nSize = iVar7 + 1;
                ppvVar4[iVar7] = piVar9;
                uVar5 = *(ulong *)(piVar1 + 6);
              }
            }
            uVar2 = uVar2 + 1;
          } while (uVar2 < ((uint)(uVar5 >> 6) & 0x3ffffff));
        }
      }
      lVar11 = lVar11 + 1;
      pVVar3 = p->vObjs;
    } while (lVar11 < pVVar3->nSize);
  }
  return;
}

Assistant:

void Ssw_MatchingExtendOne( Aig_Man_t * p, Vec_Ptr_t * vNodes )
{
    Aig_Obj_t * pNext, * pObj;
    int i, k, iFan = -1;
    Vec_PtrClear( vNodes );
    Aig_ManIncrementTravId( p );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        if ( pObj->pData != NULL )
            continue;
        if ( Saig_ObjIsLo(p, pObj) )
        {
            pNext = Saig_ObjLoToLi(p, pObj);
            pNext = Aig_ObjFanin0(pNext);
            if ( pNext->pData && !Aig_ObjIsTravIdCurrent(p, pNext) && !Aig_ObjIsConst1(pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
        }
        if ( Aig_ObjIsNode(pObj) )
        {
            pNext = Aig_ObjFanin0(pObj);
            if ( pNext->pData && !Aig_ObjIsTravIdCurrent(p, pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
            pNext = Aig_ObjFanin1(pObj);
            if ( pNext->pData && !Aig_ObjIsTravIdCurrent(p, pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
        }
        Aig_ObjForEachFanout( p, pObj, pNext, iFan, k )
        {
            if ( Saig_ObjIsPo(p, pNext) )
                continue;
            if ( Saig_ObjIsLi(p, pNext) )
                pNext = Saig_ObjLiToLo(p, pNext);
            if ( pNext->pData && !Aig_ObjIsTravIdCurrent(p, pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
        }
    }
}